

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O3

void do_fmlal(float32 *d,void *vn,void *vm,float_status *fpst,uint32_t desc,_Bool fz16)

{
  uint uVar1;
  float32 fVar2;
  float32 xb;
  ulong uVar3;
  sbyte sVar4;
  uint uVar5;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  float32 *pfVar10;
  uintptr_t i;
  ulong uVar6;
  
  uVar1 = desc * 8 & 0xff;
  uVar5 = uVar1 + 8;
  uVar6 = (ulong)uVar5;
  uVar5 = (uint)(uVar5 == 0x10);
  uVar3 = (ulong)((desc >> 0xb & uVar5) << 3);
  sVar4 = (sbyte)((~uVar5 & desc >> 0xb & 1) << 5);
  uVar8 = *(ulong *)((long)vn + uVar3) >> sVar4;
  uVar3 = *(ulong *)((long)vm + uVar3);
  uVar7 = uVar8 ^ 0x8000800080008000;
  if ((desc >> 10 & 1) == 0) {
    uVar7 = uVar8;
  }
  lVar9 = 0;
  pfVar10 = d;
  do {
    fVar2 = float16_to_float32_by_bits((uint32_t)(uVar7 >> ((byte)lVar9 & 0x3f)),fz16);
    xb = float16_to_float32_by_bits((uint32_t)((uVar3 >> sVar4) >> ((byte)lVar9 & 0x3f)),fz16);
    fVar2 = float32_muladd_aarch64(fVar2,xb,*pfVar10,0,fpst);
    *pfVar10 = fVar2;
    lVar9 = lVar9 + 0x10;
    pfVar10 = pfVar10 + 1;
  } while ((ulong)((desc & 0x1f) << 5) + 0x20 != lVar9);
  uVar5 = desc >> 2 & 0xf8;
  if (uVar1 < uVar5) {
    uVar7 = (ulong)(uVar5 + 8);
    uVar3 = uVar6 + 8;
    if (uVar6 + 8 < uVar7) {
      uVar3 = uVar7;
    }
    memset((void *)((long)d + uVar6),0,(~uVar6 + uVar3 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

static void do_fmlal(float32 *d, void *vn, void *vm, float_status *fpst,
                     uint32_t desc, bool fz16)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    int is_s = extract32(desc, SIMD_DATA_SHIFT, 1);
    int is_2 = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    int is_q = oprsz == 16;
    uint64_t n_4, m_4;

    /* Pre-load all of the f16 data, avoiding overlap issues.  */
    n_4 = load4_f16(vn, is_q, is_2);
    m_4 = load4_f16(vm, is_q, is_2);

    /* Negate all inputs for FMLSL at once.  */
    if (is_s) {
        n_4 ^= 0x8000800080008000ull;
    }

    for (i = 0; i < oprsz / 4; i++) {
        float32 n_1 = float16_to_float32_by_bits(n_4 >> (i * 16), fz16);
        float32 m_1 = float16_to_float32_by_bits(m_4 >> (i * 16), fz16);
        d[H4(i)] = float32_muladd(n_1, m_1, d[H4(i)], 0, fpst);
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}